

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::types::FunctionTy::display(FunctionTy *this,ostream *o)

{
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar2;
  undefined8 extraout_RDX;
  pointer psVar3;
  
  std::operator<<(o,"Fn(");
  for (psVar3 = (this->params).
                super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar3 != (this->params).
                super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
    if (psVar3 != (this->params).
                  super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<(o,", ");
    }
    peVar1 = (psVar3->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (**(peVar1->super_Displayable)._vptr_Displayable)(peVar1,o);
  }
  poVar2 = std::operator<<(o,") -> ");
  peVar1 = (this->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  UNRECOVERED_JUMPTABLE = *(peVar1->super_Displayable)._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(peVar1,poVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void FunctionTy::display(std::ostream& o) const {
  o << "Fn(";
  for (auto i = params.begin(); i != params.end(); i++) {
    if (i != params.begin()) o << ", ";
    o << **i;
  }
  o << ") -> " << *ret;
}